

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

ostream * Imath_3_2::operator<<(ostream *s,Vec2<int> *v)

{
  ostream *poVar1;
  char local_b [3];
  
  local_b[0] = '(';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(s,local_b,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->x);
  local_b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->y);
  local_b[2] = 0x29;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 2,1);
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Vec2<T>& v)
{
    return s << '(' << v.x << ' ' << v.y << ')';
}